

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_set_zero(mbedtls_ecp_point *pt)

{
  int local_14;
  int ret;
  mbedtls_ecp_point *pt_local;
  
  local_14 = mbedtls_mpi_lset(&pt->X,1);
  if ((local_14 == 0) && (local_14 = mbedtls_mpi_lset(&pt->Y,1), local_14 == 0)) {
    local_14 = mbedtls_mpi_lset(&pt->Z,0);
  }
  return local_14;
}

Assistant:

int mbedtls_ecp_set_zero( mbedtls_ecp_point *pt )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    ECP_VALIDATE_RET( pt != NULL );

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->X , 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Y , 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Z , 0 ) );

cleanup:
    return( ret );
}